

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HiResTimer.cpp
# Opt level: O2

double __thiscall PlatformAgnostic::DateTime::HiResTimer::GetSystemTime(HiResTimer *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ULONGLONG UVar4;
  ulong uVar5;
  tm *ptVar6;
  undefined4 *puVar7;
  int old_sec;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 local_78 [8];
  tm utc_tm;
  undefined1 local_38 [8];
  timeval timeval;
  
  UVar4 = GetTickCount64();
  uVar5 = UVar4 - (this->data).cacheTick;
  if ((this->data).previousDifference < uVar5 && uVar5 < 5) {
    (this->data).previousDifference = uVar5;
    dVar10 = (double)(long)uVar5 + (this->data).cacheSysTime;
  }
  else {
    utc_tm.tm_zone = (char *)time((time_t *)0x0);
    iVar3 = gettimeofday((timeval *)local_38,(__timezone_ptr_t)0x0);
    ptVar6 = gmtime_r((time_t *)&utc_tm.tm_zone,(tm *)local_78);
    if (ptVar6 == (tm *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/PlatformAgnostic/Platform/Common/HiResTimer.cpp"
                         ,0x27,"(false)","gmtime() failed");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    if (iVar3 == -1) {
      dVar10 = 0.0;
    }
    else if (local_78._0_4_ == (int)((long)local_38 % 0x3c)) {
      uVar5 = (ulong)((double)timeval.tv_sec / 1000.0);
      uVar5 = (long)((double)timeval.tv_sec / 1000.0 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f
              | uVar5;
      auVar9._8_4_ = (int)(uVar5 >> 0x20);
      auVar9._0_8_ = uVar5;
      auVar9._12_4_ = 0x45300000;
      dVar10 = ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0) +
               (auVar9._8_8_ - 1.9342813113834067e+25);
    }
    else {
      dVar10 = 999.0;
    }
    dVar10 = (double)(int)local_78._0_4_ * 1000.0 +
             (double)utc_tm.tm_sec * 3600000.0 + (double)(int)local_78._4_4_ * 60000.0 + dVar10;
    uVar5 = (ulong)dVar10;
    uVar5 = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
    auVar11._8_4_ = (int)(uVar5 >> 0x20);
    auVar11._0_8_ = uVar5;
    auVar11._12_4_ = 0x45300000;
    dVar10 = Js::DateUtilities::TvFromDate
                       ((double)(utc_tm.tm_mday + 0x76c),(double)utc_tm.tm_hour,
                        (double)(utc_tm.tm_min + -1),
                        ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0) +
                        (auVar11._8_8_ - 1.9342813113834067e+25));
    dVar8 = (this->data).cacheSysTime;
    if ((dVar10 < dVar8) || (dVar8 = dVar8 + 5.0, dVar8 <= dVar10)) {
      (this->data).previousDifference = 0;
      (this->data).cacheSysTime = dVar10;
      (this->data).cacheTick = UVar4;
    }
    else {
      (this->data).previousDifference = 0xffffffffffffffff;
      dVar10 = dVar8;
    }
  }
  return dVar10;
}

Assistant:

double HiResTimer::GetSystemTime()
    {
        ULONGLONG current = GetTickCount64();
        ULONGLONG diff = current - data.cacheTick;

        if (diff <= data.previousDifference || diff >= INTERVAL_FOR_TICK_BACKUP) // max *ms to respond system time changes
        {
            double currentTime = GetSystemTimeREAL();

            // in case the system time wasn't updated backwards, and cache is still beyond...
            if (currentTime >= data.cacheSysTime && currentTime < data.cacheSysTime + INTERVAL_FOR_TICK_BACKUP)
            {
                data.previousDifference = (ULONGLONG) -1; // Make sure next request won't use cache
                return data.cacheSysTime + INTERVAL_FOR_TICK_BACKUP; // wait for real time
            }

            data.previousDifference = 0;
            data.cacheSysTime = currentTime;
            data.cacheTick = current;

            return currentTime;
        }

        // tick count is circular. So, make sure tick wasn't cycled since the last request
        data.previousDifference = diff;
        return data.cacheSysTime + (double)diff;
    }